

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

short duckdb::DecimalScaleUpCheckOperator::Operation<short,short>
                (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  string error;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60 [32];
  string local_40;
  
  sVar1 = *(short *)((long)dataptr + 0x20);
  uVar3 = (uint)input;
  if ((input < sVar1) &&
     (uVar2 = -(int)sVar1, uVar3 != uVar2 && SBORROW4(uVar3,uVar2) == (int)(uVar3 + (int)sVar1) < 0)
     ) {
    sVar1 = Cast::Operation<short,short>(input);
    sVar1 = sVar1 * *(short *)((long)dataptr + 0x22);
  }
  else {
    ::std::__cxx11::string::string
              (local_60,"Casting value \"%s\" to type %s failed: value is out of range!",&local_a1);
    Decimal::ToString_abi_cxx11_
              (&local_80,(Decimal *)(ulong)uVar3,(ushort)*(byte *)((long)dataptr + 0x24),
               *(uint8_t *)((long)dataptr + 0x25),in_R8B);
    LogicalType::ToString_abi_cxx11_(&local_a0,(LogicalType *)(*dataptr + 8));
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_40,(StringUtil *)local_60,&local_80,&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000081,in_R8B));
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string(local_60);
    sVar1 = HandleVectorCastError::Operation<short>
                      (&local_40,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return sVar1;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}